

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberUtilities.cpp
# Opt level: O0

double Js::NumberUtilities::Modulus(double dblLeft,double dblRight)

{
  bool bVar1;
  double local_20;
  double value;
  double dblRight_local;
  double dblLeft_local;
  
  bVar1 = IsFinite(dblRight);
  local_20 = dblLeft;
  if (bVar1) {
    if (((dblRight == 0.0) && (!NAN(dblRight))) || (bVar1 = IsNan(dblLeft), bVar1)) {
      local_20 = NumberConstants::NaN;
    }
    else if ((dblLeft != 0.0) || (NAN(dblLeft))) {
      local_20 = fmod(dblLeft,dblRight);
    }
  }
  else {
    bVar1 = IsNan(dblRight);
    if ((bVar1) || (bVar1 = IsFinite(dblLeft), !bVar1)) {
      local_20 = NumberConstants::NaN;
    }
  }
  return local_20;
}

Assistant:

double NumberUtilities::Modulus(double dblLeft, double dblRight)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Op_Rem_Double);
        double value = 0;

        if (!Js::NumberUtilities::IsFinite(dblRight))
        {
            if (NumberUtilities::IsNan(dblRight) || !Js::NumberUtilities::IsFinite(dblLeft))
            {
                value = NumberConstants::NaN;
            }
            else
            {
                value =  dblLeft;
            }
        }
        else if (0 == dblRight || NumberUtilities::IsNan(dblLeft))
        {
            value =  NumberConstants::NaN;
        }
        else if (0 == dblLeft)
        {
            value =  dblLeft;
        }
        else
        {
            value = fmod(dblLeft, dblRight);
        }

        return value;
        JIT_HELPER_END(Op_Rem_Double);
    }